

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O2

string * __thiscall
t_javame_generator::get_enum_class_name_abi_cxx11_
          (string *__return_storage_ptr__,t_javame_generator *this,t_type *type)

{
  t_program *this_00;
  int iVar1;
  undefined4 extraout_var;
  string package;
  allocator local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_a0,"",(allocator *)&local_40);
  this_00 = type->program_;
  if ((this_00 != (t_program *)0x0) &&
     (this_00 != (this->super_t_oop_generator).super_t_generator.program_)) {
    std::__cxx11::string::string((string *)&local_80,"java",&local_a1);
    t_program::get_namespace(&local_60,this_00,&local_80);
    std::operator+(&local_40,&local_60,".");
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  iVar1 = (*(type->super_t_doc)._vptr_t_doc[3])(type);
  std::operator+(__return_storage_ptr__,&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar1));
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::string t_javame_generator::get_enum_class_name(t_type* type) {
  string package = "";
  t_program* program = type->get_program();
  if (program != nullptr && program != program_) {
    package = program->get_namespace("java") + ".";
  }
  return package + type->get_name();
}